

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void __thiscall mjs::print_visitor::operator()(print_visitor *this,labelled_statement *s)

{
  wostream *pwVar1;
  wostringstream _woss;
  wstring_view local_198;
  wostringstream local_188 [376];
  
  std::__cxx11::wostringstream::wostringstream(local_188);
  pwVar1 = std::operator<<((wostream *)local_188,"Not implemented: ");
  (*(s->super_statement).super_syntax_node._vptr_syntax_node[2])(s,pwVar1);
  std::__cxx11::wstringbuf::str();
  throw_runtime_error(&local_198,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/printer.cpp"
                      ,0xfe);
}

Assistant:

void operator()(const labelled_statement& s) {
        NOT_IMPLEMENTED(s);
    }